

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O0

void __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::setUniformIndices
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,int N)

{
  vector<int,_std::allocator<int>_> *__p;
  __shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *this_01;
  reference pvVar1;
  int in_ESI;
  size_type in_RDI;
  int i;
  vector<int,_std::allocator<int>_> *in_stack_00000068;
  vector<int,_std::allocator<int>_> *in_stack_00000070;
  undefined4 in_stack_ffffffffffffffd0;
  value_type in_stack_ffffffffffffffd4;
  int iVar2;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  __p = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x10);
  this_00 = (__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> *)
            operator_new(0x18);
  memset(this_00,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xbaf098);
  std::__shared_ptr<std::vector<int,std::allocator<int>>,(__gnu_cxx::_Lock_policy)2>::
  reset<std::vector<int,std::allocator<int>>>(this_00,__p);
  std::
  __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0xbaf0b5);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI)
  ;
  iVar2 = 0;
  while (iVar2 < in_ESI) {
    iVar3 = iVar2;
    this_01 = std::
              __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)iVar3);
    *pvVar1 = iVar2;
    in_stack_ffffffffffffffd4 = iVar2;
    iVar2 = iVar3 + 1;
  }
  std::
  __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000070,in_stack_00000068);
  return;
}

Assistant:

void
opengv::sac::SampleConsensusProblem<M>::setUniformIndices(int N)
{
  indices_.reset( new std::vector<int>() );
  indices_->resize(N);
  for( int i = 0; i < N; ++i )
    (*indices_)[i] = i;
  shuffled_indices_ = *indices_;
}